

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O0

void __thiscall
CNscContext::GetFence
          (CNscContext *this,CNscPStackEntry *pEntry,size_t nFnSymbol,NscFenceType nFenceType,
          bool fEatScope)

{
  void *pvVar1;
  int in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  NscSymbolFence *in_stack_ffffffffffffffc8;
  CNscSymbolTable *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffe0;
  byte bVar2;
  
  bVar2 = in_R8B & 1;
  if (*(long *)(in_RSI + 0x18) == 0) {
    pvVar1 = operator_new(0x238);
    *(void **)(in_RSI + 0x18) = pvVar1;
  }
  else if (*(int *)(*(long *)(in_RSI + 0x18) + 0x10) == 2) {
    in_stack_ffffffffffffffd0 = *(CNscSymbolTable **)(*(long *)(in_RSI + 0x18) + 0x30);
    if (in_stack_ffffffffffffffd0 != (CNscSymbolTable *)0x0) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 (CONCAT44(in_ECX,CONCAT13(in_R8B,in_stack_ffffffffffffffe0)) & 0xffffffff01ffffff))
      ;
      operator_delete(in_stack_ffffffffffffffd0);
    }
    *(undefined8 *)(*(long *)(in_RSI + 0x18) + 0x30) = 0;
  }
  CNscSymbolTable::GetFence(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined8 *)(*(long *)(in_RSI + 0x18) + 8) = in_RDX;
  *(int *)(*(long *)(in_RSI + 0x18) + 0x10) = in_ECX;
  *(byte *)(*(long *)(in_RSI + 0x18) + 0x18) = bVar2 & 1;
  *(undefined8 *)(*(long *)(in_RSI + 0x18) + 0x28) = *(undefined8 *)(in_RDI + 0x6b8);
  *(undefined4 *)(*(long *)(in_RSI + 0x18) + 0x1c) = 0;
  *(undefined4 *)(*(long *)(in_RSI + 0x18) + 0x20) = 0;
  *(undefined1 *)(*(long *)(in_RSI + 0x18) + 0x19) = 0;
  *(undefined4 *)(*(long *)(in_RSI + 0x18) + 0x14) = 0;
  if (*(long *)(in_RDI + 0x6b8) != 0) {
    *(int *)(*(long *)(in_RSI + 0x18) + 0x20) =
         *(int *)(*(long *)(in_RDI + 0x6b8) + 0x1c) + *(int *)(*(long *)(in_RDI + 0x6b8) + 0x20) +
         *(int *)(*(long *)(in_RSI + 0x18) + 0x20);
  }
  if (in_ECX == 0) {
    *(undefined4 *)(*(long *)(in_RSI + 0x18) + 0x30) = 0;
    *(undefined1 *)(*(long *)(in_RSI + 0x18) + 0x34) = 0;
  }
  else if (in_ECX == 2) {
    pvVar1 = operator_new(0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x207a26);
    *(void **)(*(long *)(in_RSI + 0x18) + 0x30) = pvVar1;
  }
  *(undefined1 *)(in_RSI + 0x488) = 1;
  *(undefined8 *)(in_RDI + 0x6b8) = *(undefined8 *)(in_RSI + 0x18);
  return;
}

Assistant:

void GetFence (CNscPStackEntry *pEntry, size_t nFnSymbol,
		NscFenceType nFenceType, bool fEatScope)
	{
		if (pEntry ->m_pFence == NULL)
			pEntry ->m_pFence = new NscSymbolFence;
		else
		{
			if (pEntry ->m_pFence ->nFenceType == NscFenceType_Switch)
			{
				delete pEntry ->m_pFence ->pSwitchCasesUsed;
				pEntry ->m_pFence ->pSwitchCasesUsed = NULL;
			}
		}
		m_sSymbols .GetFence (pEntry ->m_pFence);
		pEntry ->m_pFence ->nFnSymbol = nFnSymbol;
		pEntry ->m_pFence ->nFenceType = nFenceType;
		pEntry ->m_pFence ->fEatScope = fEatScope;
		pEntry ->m_pFence ->pNext = m_pCurrentFence;
		pEntry ->m_pFence ->nLocals = 0;
		pEntry ->m_pFence ->nPrevLocals = 0;
		pEntry ->m_pFence ->fHasDefault = false;
		pEntry ->m_pFence ->nFenceReturn = NscFenceReturn_Unknown;
		if (m_pCurrentFence)
		{
			pEntry ->m_pFence ->nPrevLocals += 
				m_pCurrentFence ->nLocals +
				m_pCurrentFence ->nPrevLocals;
		}
		if (nFenceType == NscFenceType_Function)
		{
			pEntry ->m_pFence ->nFunctionLocals = 0;
			pEntry ->m_pFence ->fWarnedLocalOverflow = false;
		}
		else if (nFenceType == NscFenceType_Switch)
		{
			pEntry ->m_pFence ->pSwitchCasesUsed = new CaseValueVec;
		}
		pEntry ->m_fFenceValid = true;
		m_pCurrentFence = pEntry ->m_pFence;
		return;
	}